

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall
amrex::EB2::Level::prepareForCoarsening(Level *this,Level *rhs,int max_grid_size,IntVect ngrow)

{
  BoxArray *this_00;
  DistributionMapping *this_01;
  long *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Level *pLVar5;
  Level *pLVar6;
  Level *this_02;
  int idim;
  int iVar7;
  long lVar8;
  long lVar9;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *this_03;
  long lVar10;
  long lVar11;
  IntVect edge_type;
  MFInfo local_328;
  Level *local_300;
  FabFactory<amrex::FArrayBox> local_2f8;
  Level *local_2f0;
  BoxArray *local_2e8;
  MFIter mfi;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> covered_boxes;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> cut_boxes;
  BoxArray all_grids;
  FabArray<amrex::EBCellFlagFab> cflag;
  
  uVar2 = *(undefined8 *)(this->m_geom).domain.smallend.vect;
  uVar3 = *(undefined8 *)(this->m_geom).domain.bigend.vect;
  uVar4 = *(undefined8 *)((this->m_geom).domain.bigend.vect + 2);
  cflag.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       (BATType)*(undefined8 *)((this->m_geom).domain.smallend.vect + 2);
  cflag.super_FabArrayBase._vptr_FabArrayBase._0_4_ = (int)uVar2;
  cflag.super_FabArrayBase._vptr_FabArrayBase._4_4_ = (int)((ulong)uVar2 >> 0x20);
  cflag.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype = SUB84(uVar3,0);
  cflag.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
       SUB84((ulong)uVar3 >> 0x20,0);
  cflag.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)
       CONCAT44(cflag.super_FabArrayBase._vptr_FabArrayBase._4_4_ - ngrow.vect[1],
                (int)cflag.super_FabArrayBase._vptr_FabArrayBase - ngrow.vect[0]);
  cflag.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       cflag.super_FabArrayBase.boxarray.m_bat.m_bat_type - ngrow.vect[2];
  cflag.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
       (BATindexType)
       ((int)cflag.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype + ngrow.vect[0]);
  cflag.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
       (IndexType)
       ((int)cflag.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype + ngrow.vect[1]);
  cflag.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = (int)uVar4;
  cflag.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] =
       (int)((ulong)uVar4 >> 0x20);
  cflag.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] =
       cflag.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] + ngrow.vect[2];
  local_2f0 = rhs;
  BoxArray::BoxArray(&all_grids,(Box *)&cflag);
  BoxArray::maxSize(&all_grids,max_grid_size);
  local_300 = this;
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)&local_328,&all_grids,*(int *)(ParallelContext::frames + 0x10));
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  cut_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__FabFactory_006d9098;
  FabArray<amrex::EBCellFlagFab>::FabArray
            (&cflag,&all_grids,(DistributionMapping *)&local_328,1,1,(MFInfo *)&mfi,
             (FabFactory<amrex::EBCellFlagFab> *)
             &cut_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>);
  pLVar5 = local_2f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_328.arena);
  fillEBCellFlag(pLVar5,&cflag,&local_300->m_geom);
  cut_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cut_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cut_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  covered_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  covered_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  covered_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MFIter::MFIter(&mfi,&cflag.super_FabArrayBase,'\0');
  while (mfi.currentIndex < mfi.endIndex) {
    iVar7 = mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      iVar7 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [mfi.currentIndex];
    }
    iVar7 = *(int *)&(cflag.m_fabs_v.
                      super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar7]->
                     super_BaseFab<amrex::EBCellFlag>).field_0x44;
    MFIter::validbox((Box *)&local_328,&mfi);
    if (iVar7 != 0) {
      this_03 = &cut_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>;
      if (iVar7 == -1) {
        this_03 = &covered_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>;
      }
      std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back(this_03,(Box *)&local_328);
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  AllGatherBoxes(&cut_boxes,0);
  pLVar6 = local_2f0;
  pLVar5 = local_300;
  AllGatherBoxes(&covered_boxes,0);
  if (covered_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      covered_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    BoxList::BoxList((BoxList *)&local_328,&covered_boxes);
    BoxArray::BoxArray((BoxArray *)&mfi,(BoxList *)&local_328);
    BoxArray::operator=(&pLVar5->m_covered_grids,(BoxArray *)&mfi);
    BoxArray::~BoxArray((BoxArray *)&mfi);
    std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
              ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_328);
  }
  if (cut_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      cut_boxes.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    Assert_host("!cut_boxes.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_Level.cpp"
                ,0x27,"\"EB2::Level: how come there are no cut boxes?\"");
  }
  BoxList::BoxList((BoxList *)&local_328,&cut_boxes);
  BoxArray::BoxArray((BoxArray *)&mfi,(BoxList *)&local_328);
  this_00 = &pLVar5->m_grids;
  BoxArray::operator=(this_00,(BoxArray *)&mfi);
  BoxArray::~BoxArray((BoxArray *)&mfi);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_328);
  DistributionMapping::DistributionMapping
            ((DistributionMapping *)&mfi,this_00,*(int *)(ParallelContext::frames + 0x10));
  this_01 = &pLVar5->m_dmap;
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)this_01,
             (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)&mfi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&mfi.fabArray);
  edge_type.vect[0] = 1;
  edge_type.vect[1] = 1;
  edge_type.vect[2] = 1;
  convert((BoxArray *)&mfi,this_00,&edge_type);
  local_328._0_8_ = (element_type *)0x1;
  local_328.arena = (Arena *)0x0;
  local_328.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
  MultiFab::define(&pLVar5->m_levelset,(BoxArray *)&mfi,this_01,1,0,&local_328,&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  BoxArray::~BoxArray((BoxArray *)&mfi);
  fillLevelSet(pLVar6,&pLVar5->m_levelset,&pLVar5->m_geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_328._0_8_ = &PTR__FabFactory_006d9098;
  FabArray<amrex::EBCellFlagFab>::define
            (&pLVar5->m_cellflag,this_00,this_01,1,2,(MFInfo *)&mfi,
             (FabFactory<amrex::EBCellFlagFab> *)&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  fillEBCellFlag(pLVar6,&pLVar5->m_cellflag,&pLVar5->m_geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_328._0_8_ = &PTR__FabFactory_006d8928;
  MultiFab::define(&pLVar5->m_volfrac,this_00,this_01,1,2,(MFInfo *)&mfi,
                   (FabFactory<amrex::FArrayBox> *)&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  fillVolFrac(pLVar6,&pLVar5->m_volfrac,&pLVar5->m_geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_328._0_8_ = &PTR__FabFactory_006d8928;
  MultiFab::define(&pLVar5->m_centroid,this_00,this_01,3,2,(MFInfo *)&mfi,
                   (FabFactory<amrex::FArrayBox> *)&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  fillCentroid(pLVar6,&pLVar5->m_centroid,&pLVar5->m_geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_328._0_8_ = &PTR__FabFactory_006d8928;
  MultiFab::define(&pLVar5->m_bndryarea,this_00,this_01,1,2,(MFInfo *)&mfi,
                   (FabFactory<amrex::FArrayBox> *)&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  fillBndryArea(pLVar6,&pLVar5->m_bndryarea,&pLVar5->m_geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_328._0_8_ = &PTR__FabFactory_006d8928;
  MultiFab::define(&pLVar5->m_bndrycent,this_00,this_01,3,2,(MFInfo *)&mfi,
                   (FabFactory<amrex::FArrayBox> *)&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  fillBndryCent(pLVar6,&pLVar5->m_bndrycent,&pLVar5->m_geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_328._0_8_ = &PTR__FabFactory_006d8928;
  MultiFab::define(&pLVar5->m_bndrynorm,this_00,this_01,3,2,(MFInfo *)&mfi,
                   (FabFactory<amrex::FArrayBox> *)&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  fillBndryNorm(pLVar6,&pLVar5->m_bndrynorm,&pLVar5->m_geom);
  lVar9 = 0x11c8;
  lVar10 = 0x1648;
  lVar8 = 0;
  local_2e8 = this_00;
  for (lVar11 = 0xd48; this_02 = local_2f0, pLVar6 = local_300, lVar11 != 0x11c8;
      lVar11 = lVar11 + 0x180) {
    iVar7 = (int)lVar8;
    if (iVar7 == 1) {
      edge_type.vect[2] = 0;
      edge_type.vect[0] = 0;
      edge_type.vect[1] = 1;
    }
    else if (iVar7 == 0) {
      edge_type.vect[0] = 1;
      edge_type.vect[1] = 0;
      edge_type.vect[2] = 0;
    }
    else {
      edge_type.vect[0] = 0;
      edge_type.vect[1] = 0;
      edge_type.vect[2] = 1;
    }
    convert((BoxArray *)&mfi,local_2e8,&edge_type);
    plVar1 = (long *)((long)(local_300->m_geom).super_CoordSys.offset + lVar11 + -8);
    local_328._0_8_ = (element_type *)0x1;
    local_328.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328.arena = (Arena *)0x0;
    local_328.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
    (**(code **)(*plVar1 + 0x10))(plVar1,(BoxArray *)&mfi,this_01,1,2,&local_328,&local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_328.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    BoxArray::~BoxArray((BoxArray *)&mfi);
    if (iVar7 == 1) {
      edge_type.vect[2] = 0;
      edge_type.vect[0] = 0;
      edge_type.vect[1] = 1;
    }
    else if (iVar7 == 0) {
      edge_type.vect[0] = 1;
      edge_type.vect[1] = 0;
      edge_type.vect[2] = 0;
    }
    else {
      edge_type.vect[0] = 0;
      edge_type.vect[1] = 0;
      edge_type.vect[2] = 1;
    }
    convert((BoxArray *)&mfi,local_2e8,&edge_type);
    local_328._0_8_ = (element_type *)0x1;
    local_328.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328.arena = (Arena *)0x0;
    local_328.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
    (**(code **)(*(long *)((long)&(local_300->m_cellflag).super_FabArrayBase.boxarray.m_bat.m_op +
                          lVar11 + 0x2c) + 0x10))
              ((long)(local_300->m_geom).super_CoordSys.offset + lVar9 + -8,(BoxArray *)&mfi,this_01
               ,2,2,&local_328,&local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_328.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    BoxArray::~BoxArray((BoxArray *)&mfi);
    edge_type.vect[0] = 1;
    edge_type.vect[1] = 1;
    edge_type.vect[2] = 1;
    edge_type.vect[lVar8] = 0;
    convert((BoxArray *)&mfi,local_2e8,&edge_type);
    local_328._0_8_ = (element_type *)0x1;
    local_328.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328.arena = (Arena *)0x0;
    local_328.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
    (**(code **)(*(long *)((long)&(local_300->m_bndryarea).super_FabArray<amrex::FArrayBox>.
                                  super_FabArrayBase.boxarray.m_bat.m_op + lVar11 + 0x2cU) + 0x10))
              ((long)(local_300->m_geom).super_CoordSys.offset + lVar10 + -8,(BoxArray *)&mfi,
               this_01,1,2,&local_328,&local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_328.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    BoxArray::~BoxArray((BoxArray *)&mfi);
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 0x180;
    lVar10 = lVar10 + 0x180;
  }
  mfi.fabArray = (FabArrayBase *)((local_300->m_areafrac)._M_elems + 1);
  mfi.tile_size.vect._0_8_ = (local_300->m_areafrac)._M_elems + 2;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       &pLVar5->m_areafrac;
  fillAreaFrac(local_2f0,(Array<MultiFab_*,_3> *)&mfi,&local_300->m_geom);
  mfi.fabArray = (FabArrayBase *)((pLVar6->m_facecent)._M_elems + 1);
  mfi.tile_size.vect._0_8_ = (pLVar6->m_facecent)._M_elems + 2;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       &pLVar5->m_facecent;
  fillFaceCent(this_02,(Array<MultiFab_*,_3> *)&mfi,&pLVar6->m_geom);
  mfi.fabArray = (FabArrayBase *)((pLVar6->m_edgecent)._M_elems + 1);
  mfi.tile_size.vect._0_8_ = (pLVar6->m_edgecent)._M_elems + 2;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       &pLVar5->m_edgecent;
  fillEdgeCent(this_02,(Array<MultiFab_*,_3> *)&mfi,&pLVar6->m_geom);
  pLVar6->m_ok = true;
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&covered_boxes);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&cut_boxes);
  FabArray<amrex::EBCellFlagFab>::~FabArray(&cflag);
  BoxArray::~BoxArray(&all_grids);
  return;
}

Assistant:

void
Level::prepareForCoarsening (const Level& rhs, int max_grid_size, IntVect ngrow)
{
    BoxArray all_grids(amrex::grow(m_geom.Domain(),ngrow));
    all_grids.maxSize(max_grid_size);
    FabArray<EBCellFlagFab> cflag(all_grids, DistributionMapping{all_grids}, 1, 1);
    rhs.fillEBCellFlag(cflag, m_geom);

    Vector<Box> cut_boxes;
    Vector<Box> covered_boxes;

    for (MFIter mfi(cflag); mfi.isValid(); ++mfi)
    {
        FabType t = cflag[mfi].getType();
        AMREX_ASSERT(t != FabType::undefined);
        const Box& vbx = mfi.validbox();
        if (t == FabType::covered) {
            covered_boxes.push_back(vbx);
        } else if (t != FabType::regular) {
            cut_boxes.push_back(vbx);
        }
    }

    amrex::AllGatherBoxes(cut_boxes);
    amrex::AllGatherBoxes(covered_boxes);

    if (!covered_boxes.empty()) {
        m_covered_grids = BoxArray(BoxList(std::move(covered_boxes)));
    }

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(!cut_boxes.empty(),
                                     "EB2::Level: how come there are no cut boxes?");

    m_grids = BoxArray(BoxList(std::move(cut_boxes)));
    m_dmap = DistributionMapping(m_grids);

    m_levelset.define(amrex::convert(m_grids,IntVect::TheNodeVector()), m_dmap, 1, 0);
    rhs.fillLevelSet(m_levelset, m_geom);

//    m_mgf.define(m_grids, m_dmap);
    const int ng = 2;
    m_cellflag.define(m_grids, m_dmap, 1, ng);
    rhs.fillEBCellFlag(m_cellflag, m_geom);

    m_volfrac.define(m_grids, m_dmap, 1, ng);
    rhs.fillVolFrac(m_volfrac, m_geom);

    m_centroid.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    rhs.fillCentroid(m_centroid, m_geom);

    m_bndryarea.define(m_grids, m_dmap, 1, ng);
    rhs.fillBndryArea(m_bndryarea, m_geom);

    m_bndrycent.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    rhs.fillBndryCent(m_bndrycent, m_geom);

    m_bndrynorm.define(m_grids, m_dmap, AMREX_SPACEDIM, ng);
    rhs.fillBndryNorm(m_bndrynorm, m_geom);

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        m_areafrac[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, 1, ng);
        m_facecent[idim].define(amrex::convert(m_grids, IntVect::TheDimensionVector(idim)),
                                m_dmap, AMREX_SPACEDIM-1, ng);
        IntVect edge_type{1}; edge_type[idim] = 0;
        m_edgecent[idim].define(amrex::convert(m_grids, edge_type), m_dmap, 1, ng);
    }
    rhs.fillAreaFrac(amrex::GetArrOfPtrs(m_areafrac), m_geom);
    rhs.fillFaceCent(amrex::GetArrOfPtrs(m_facecent), m_geom);
    rhs.fillEdgeCent(amrex::GetArrOfPtrs(m_edgecent), m_geom);

    m_ok = true;
}